

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkFanio.c
# Opt level: O2

void Nwk_ObjTransferFanout(Nwk_Obj_t *pNodeFrom,Nwk_Obj_t *pNodeTo)

{
  int iVar1;
  Vec_Ptr_t *vNodes;
  long lVar2;
  
  if (((*(uint *)&pNodeFrom->field_0x20 & 7) == 2) || ((*(uint *)&pNodeTo->field_0x20 & 7) == 2)) {
    __assert_fail("!Nwk_ObjIsCo(pNodeFrom) && !Nwk_ObjIsCo(pNodeTo)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkFanio.c"
                  ,0x115,"void Nwk_ObjTransferFanout(Nwk_Obj_t *, Nwk_Obj_t *)");
  }
  if (pNodeFrom->pMan != pNodeTo->pMan) {
    __assert_fail("pNodeFrom->pMan == pNodeTo->pMan",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkFanio.c"
                  ,0x116,"void Nwk_ObjTransferFanout(Nwk_Obj_t *, Nwk_Obj_t *)");
  }
  if (pNodeFrom != pNodeTo) {
    if (pNodeFrom->nFanouts < 1) {
      __assert_fail("Nwk_ObjFanoutNum(pNodeFrom) > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkFanio.c"
                    ,0x118,"void Nwk_ObjTransferFanout(Nwk_Obj_t *, Nwk_Obj_t *)");
    }
    vNodes = pNodeFrom->pMan->vTemp;
    iVar1 = pNodeTo->nFanouts;
    Nwk_ObjCollectFanouts(pNodeFrom,vNodes);
    for (lVar2 = 0; lVar2 < vNodes->nSize; lVar2 = lVar2 + 1) {
      Nwk_ObjPatchFanin((Nwk_Obj_t *)vNodes->pArray[lVar2],pNodeFrom,pNodeTo);
    }
    if (pNodeFrom->nFanouts == 0) {
      if (pNodeTo->nFanouts == vNodes->nSize + iVar1) {
        return;
      }
      __assert_fail("Nwk_ObjFanoutNum(pNodeTo) == nFanoutsOld + Vec_PtrSize(vFanouts)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkFanio.c"
                    ,0x120,"void Nwk_ObjTransferFanout(Nwk_Obj_t *, Nwk_Obj_t *)");
    }
    __assert_fail("Nwk_ObjFanoutNum(pNodeFrom) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkFanio.c"
                  ,0x11f,"void Nwk_ObjTransferFanout(Nwk_Obj_t *, Nwk_Obj_t *)");
  }
  __assert_fail("pNodeFrom != pNodeTo",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkFanio.c"
                ,0x117,"void Nwk_ObjTransferFanout(Nwk_Obj_t *, Nwk_Obj_t *)");
}

Assistant:

void Nwk_ObjTransferFanout( Nwk_Obj_t * pNodeFrom, Nwk_Obj_t * pNodeTo )
{
    Vec_Ptr_t * vFanouts = pNodeFrom->pMan->vTemp;
    Nwk_Obj_t * pTemp;
    int nFanoutsOld, i;
    assert( !Nwk_ObjIsCo(pNodeFrom) && !Nwk_ObjIsCo(pNodeTo) );
    assert( pNodeFrom->pMan == pNodeTo->pMan );
    assert( pNodeFrom != pNodeTo );
    assert( Nwk_ObjFanoutNum(pNodeFrom) > 0 );
    // get the fanouts of the old node
    nFanoutsOld = Nwk_ObjFanoutNum(pNodeTo);
    Nwk_ObjCollectFanouts( pNodeFrom, vFanouts );
    // patch the fanin of each of them
    Vec_PtrForEachEntry( Nwk_Obj_t *, vFanouts, pTemp, i )
        Nwk_ObjPatchFanin( pTemp, pNodeFrom, pNodeTo );
    assert( Nwk_ObjFanoutNum(pNodeFrom) == 0 );
    assert( Nwk_ObjFanoutNum(pNodeTo) == nFanoutsOld + Vec_PtrSize(vFanouts) );
}